

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_utils.h
# Opt level: O2

int sunvsnprintf(char *buffer,size_t bufsz,char *format,__va_list_tag *vlist)

{
  int iVar1;
  va_list tmp;
  undefined8 local_18;
  void *pvStack_10;
  void *local_8;
  
  local_8 = vlist->reg_save_area;
  local_18._0_4_ = vlist->gp_offset;
  local_18._4_4_ = vlist->fp_offset;
  pvStack_10 = vlist->overflow_arg_area;
  iVar1 = vsnprintf(buffer,bufsz,format,&local_18);
  return iVar1;
}

Assistant:

static inline int sunvsnprintf(char* buffer, size_t bufsz, const char* format,
                               va_list vlist)
{
  int size = 0;
  va_list tmp;
  va_copy(tmp, vlist);
  size = vsnprintf(buffer, bufsz, format, tmp);
  va_end(tmp);
  return size;
}